

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.hh
# Opt level: O3

void __thiscall OpenMesh::IO::_OMReader_::~_OMReader_(_OMReader_ *this)

{
  pointer pcVar1;
  
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___OMReader__001c20f0;
  pcVar1 = (this->property_name_).super_string._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->property_name_).super_string.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~_OMReader_() { }